

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O1

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int iVar1;
  undefined4 in_register_00000014;
  GLFWcursor *cursorHandle;
  char *pcVar2;
  bool bVar3;
  
  if (action != 1) {
    return;
  }
  if (0x4d < key) {
    if (key < 0x57) {
      if (key != 0x4e) {
        if (key != 0x54) {
          return;
        }
        track_cursor = (uint)(track_cursor == 0);
        return;
      }
    }
    else {
      if (key == 0x57) {
        bVar3 = wait_events == 0;
        wait_events = (int)bVar3;
        pcVar2 = "poll";
        if (bVar3) {
          pcVar2 = "wait";
        }
        printf("(( %sing for events ))\n",pcVar2,CONCAT44(in_register_00000014,scancode));
        return;
      }
      if (key != 0x100) {
        return;
      }
      iVar1 = glfwGetInputMode(window,0x33001);
      if (iVar1 != 0x34003) {
        glfwSetWindowShouldClose(window,1);
        return;
      }
    }
    glfwSetInputMode(window,0x33001,0x34001);
    pcVar2 = "(( cursor is normal ))";
    goto LAB_001112cc;
  }
  switch(key) {
  case 0x31:
    cursorHandle = standard_cursors[0];
    break;
  case 0x32:
    cursorHandle = standard_cursors[1];
    break;
  case 0x33:
    cursorHandle = standard_cursors[2];
    break;
  case 0x34:
    cursorHandle = standard_cursors[3];
    break;
  case 0x35:
    cursorHandle = standard_cursors[4];
    break;
  case 0x36:
    cursorHandle = standard_cursors[5];
    break;
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x42:
  case 0x43:
  case 0x45:
  case 0x46:
  case 0x47:
    return;
  case 0x41:
    bVar3 = animate_cursor == 0;
    animate_cursor = (int)bVar3;
    if (bVar3) {
      return;
    }
  case 0x30:
    cursorHandle = (GLFWcursor *)0x0;
    break;
  case 0x44:
    glfwSetInputMode(window,0x33001,0x34003);
    pcVar2 = "(( cursor is disabled ))";
    goto LAB_001112cc;
  case 0x48:
    glfwSetInputMode(window,0x33001,0x34002);
    pcVar2 = "(( cursor is hidden ))";
LAB_001112cc:
    puts(pcVar2);
    return;
  default:
    if (key != 0x20) {
      return;
    }
    swap_interval = 1 - swap_interval;
    printf("(( swap interval: %i ))\n",(ulong)(uint)swap_interval,
           CONCAT44(in_register_00000014,scancode));
    glfwSwapInterval(swap_interval);
    return;
  }
  glfwSetCursor(window,cursorHandle);
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_A:
        {
            animate_cursor = !animate_cursor;
            if (!animate_cursor)
                glfwSetCursor(window, NULL);

            break;
        }

        case GLFW_KEY_ESCAPE:
        {
            if (glfwGetInputMode(window, GLFW_CURSOR) != GLFW_CURSOR_DISABLED)
            {
                glfwSetWindowShouldClose(window, GLFW_TRUE);
                break;
            }

            /* FALLTHROUGH */
        }

        case GLFW_KEY_N:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
            printf("(( cursor is normal ))\n");
            break;

        case GLFW_KEY_D:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_DISABLED);
            printf("(( cursor is disabled ))\n");
            break;

        case GLFW_KEY_H:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
            printf("(( cursor is hidden ))\n");
            break;

        case GLFW_KEY_SPACE:
            swap_interval = 1 - swap_interval;
            printf("(( swap interval: %i ))\n", swap_interval);
            glfwSwapInterval(swap_interval);
            break;

        case GLFW_KEY_W:
            wait_events = !wait_events;
            printf("(( %sing for events ))\n", wait_events ? "wait" : "poll");
            break;

        case GLFW_KEY_T:
            track_cursor = !track_cursor;
            break;

        case GLFW_KEY_0:
            glfwSetCursor(window, NULL);
            break;

        case GLFW_KEY_1:
            glfwSetCursor(window, standard_cursors[0]);
            break;

        case GLFW_KEY_2:
            glfwSetCursor(window, standard_cursors[1]);
            break;

        case GLFW_KEY_3:
            glfwSetCursor(window, standard_cursors[2]);
            break;

        case GLFW_KEY_4:
            glfwSetCursor(window, standard_cursors[3]);
            break;

        case GLFW_KEY_5:
            glfwSetCursor(window, standard_cursors[4]);
            break;

        case GLFW_KEY_6:
            glfwSetCursor(window, standard_cursors[5]);
            break;
    }
}